

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O2

void __thiscall ECDSAAdaptor_Sign_Test::TestBody(ECDSAAdaptor_Sign_Test *this)

{
  char *pcVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  AssertionResult gtest_ar;
  string local_58;
  AdaptorPair adaptor_pair;
  
  cfd::core::AdaptorUtil::Sign(&adaptor_pair,&::msg,&::sk,&adaptor);
  cfd::core::AdaptorSignature::GetData((ByteData *)&local_80,&adaptor_pair.signature);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_58,(ByteData *)&local_80);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"adaptor_sig_str","adaptor_pair.signature.GetData().GetHex()",
             &adaptor_sig_str_abi_cxx11_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x2e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AdaptorProof::GetData((ByteData *)&local_80,&adaptor_pair.proof);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_58,(ByteData *)&local_80);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"adaptor_proof_str","adaptor_pair.proof.GetData().GetHex()",
             &adaptor_proof_str_abi_cxx11_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x2f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AdaptorPair::~AdaptorPair(&adaptor_pair);
  return;
}

Assistant:

TEST(ECDSAAdaptor, Sign) {
  auto adaptor_pair = AdaptorUtil::Sign(msg, sk, adaptor);

  EXPECT_EQ(adaptor_sig_str, adaptor_pair.signature.GetData().GetHex());
  EXPECT_EQ(adaptor_proof_str, adaptor_pair.proof.GetData().GetHex());
}